

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O3

bool cmPolicies::GetPolicyID(char *id,PolicyID *pid)

{
  bool bVar1;
  long in_RAX;
  size_t sVar2;
  long lVar3;
  long id_1;
  long local_18;
  
  if (id == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmPolicies.cxx"
                  ,0xe,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  local_18 = in_RAX;
  sVar2 = strlen(id);
  if ((((sVar2 == 7) && (*id == 'C')) && (id[1] == 'M')) && (id[2] == 'P')) {
    bVar1 = cmHasLiteralSuffix<char_const*,5ul>(id,(char (*) [5])0x4af0a7);
    if (bVar1) {
      *pid = CMP0000;
    }
    else {
      lVar3 = 0;
      do {
        if (9 < (int)id[lVar3 + 3] - 0x30U) goto LAB_00276f01;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      bVar1 = cmSystemTools::StringToLong(id + 3,&local_18);
      if ((!bVar1) || (0x3f < local_18)) goto LAB_00276f01;
      *pid = (PolicyID)local_18;
    }
    bVar1 = true;
  }
  else {
LAB_00276f01:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7)
    {
    return false;
    }
  if (!cmHasLiteralPrefix(input, "CMP"))
    {
    return false;
    }
  if (cmHasLiteralSuffix(input, "0000"))
    {
    pid = cmPolicies::CMP0000;
    return true;
    }
  for (int i = 3; i < 7; ++i)
    {
    if (!isdigit(*(input + i)))
      {
      return false;
      }
    }
  long id;
  if (!cmSystemTools::StringToLong(input + 3, &id))
    {
    return false;
    }
  if (id >= cmPolicies::CMPCOUNT)
    {
    return false;
    }
  pid = cmPolicies::PolicyID(id);
  return true;
}